

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::io::LimitingInputStream::BackUp(LimitingInputStream *this,int count)

{
  ZeroCopyInputStream *pZVar1;
  int64 iVar2;
  
  pZVar1 = this->input_;
  if (this->limit_ < 0) {
    iVar2 = (int64)count;
    (*pZVar1->_vptr_ZeroCopyInputStream[3])(pZVar1,(ulong)(uint)(count - (int)this->limit_));
  }
  else {
    (*pZVar1->_vptr_ZeroCopyInputStream[3])(pZVar1,(ulong)(uint)count);
    iVar2 = (long)count + this->limit_;
  }
  this->limit_ = iVar2;
  return;
}

Assistant:

void LimitingInputStream::BackUp(int count) {
  if (limit_ < 0) {
    input_->BackUp(count - limit_);
    limit_ = count;
  } else {
    input_->BackUp(count);
    limit_ += count;
  }
}